

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::MultAdd
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *this,
          TPZFMatrix<std::complex<double>_> *x,TPZFMatrix<std::complex<double>_> *y,
          TPZFMatrix<std::complex<double>_> *z,complex<double> alpha,complex<double> beta,int opt)

{
  complex<double> beta_00;
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZFMatrix<std::complex<double>_> *pTVar4;
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *this_00;
  void *pvVar5;
  size_type sVar6;
  TPZBaseMatrix *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZFMatrix<std::complex<double>_> *in_RSI;
  TPZFMatrix<std::complex<double>_> *in_RDI;
  int in_R8D;
  TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *in_XMM2_Qa;
  int64_t ic;
  int64_t xcols;
  int i;
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> data;
  TPZFMatrix<std::complex<double>_> *Residual_local;
  int isub;
  const_iterator it;
  TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> v2work
  ;
  TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_> assemblelist;
  TPZDohrPrecondThreadV1Data<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
  v1threaddata;
  vector<std::thread,_std::allocator<std::thread>_> AllThreads;
  TPZFMatrix<std::complex<double>_> v2;
  TPZFMatrix<std::complex<double>_> v1;
  int64_t c;
  int64_t cols;
  int64_t rows;
  TPZSimpleTimer precondi;
  TPZFMatrix<std::complex<double>_> *in_stack_000009e0;
  TPZFMatrix<std::complex<double>_> *in_stack_000009e8;
  TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *in_stack_000009f0;
  list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
  *in_stack_fffffffffffffbc8;
  TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
  *in_stack_fffffffffffffbd0;
  complex<double> *in_stack_fffffffffffffbd8;
  TPZSimpleTimer *in_stack_fffffffffffffbe0;
  TPZDohrAssembleList<std::complex<double>_> *in_stack_fffffffffffffbe8;
  TPZDohrAssembleList<std::complex<double>_> *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffbfc;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffc00;
  TPZDohrAssembly<std::complex<double>_> *in_stack_fffffffffffffc08;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  TPZDohrAssembleList<std::complex<double>_> *in_stack_fffffffffffffc20;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffc28;
  TPZMatrix<std::complex<double>_> *in_stack_fffffffffffffc30;
  complex<double> *in_stack_fffffffffffffc38;
  int64_t in_stack_fffffffffffffc40;
  int64_t in_stack_fffffffffffffc48;
  TPZFMatrix<std::complex<double>_> *this_01;
  long local_358;
  int local_324;
  _Self local_2f0;
  _List_node_base *local_2e8;
  int local_2dc;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_> local_2d8 [10];
  undefined1 local_281;
  TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_> local_278;
  TPZDohrPrecondThreadV1Data<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
  *local_270;
  TPZDohrPrecondThreadV1Data<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
  local_260;
  undefined8 in_stack_fffffffffffffdc8;
  pointer in_stack_fffffffffffffdd0;
  complex<double> local_228 [10];
  complex<double> local_188 [5];
  TPZSimpleTimer *in_stack_fffffffffffffed0;
  long local_d0;
  TPZFMatrix<std::complex<double>_> *x_00;
  
  x_00 = in_RDI;
  if (in_R8D == 0) {
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    if (iVar2 == iVar3) goto LAB_01f8633f;
LAB_01f86371:
    TPZMatrix<std::complex<double>_>::Error
              ((char *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
  }
  else {
LAB_01f8633f:
    iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    if (iVar2 != iVar3) goto LAB_01f86371;
  }
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  iVar3 = TPZBaseMatrix::Cols(in_RDX);
  if (iVar2 == iVar3) {
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    iVar3 = TPZBaseMatrix::Cols(in_RCX);
    if (iVar2 == iVar3) {
      iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
      iVar3 = TPZBaseMatrix::Rows(in_RDX);
      if (iVar2 == iVar3) {
        iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
        iVar3 = TPZBaseMatrix::Rows(in_RCX);
        if (iVar2 == iVar3) goto LAB_01f8645d;
      }
    }
  }
  TPZMatrix<std::complex<double>_>::Error
            ((char *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
LAB_01f8645d:
  TPZSimpleTimer::TPZSimpleTimer((TPZSimpleTimer *)in_stack_fffffffffffffbf0);
  pTVar4 = (TPZFMatrix<std::complex<double>_> *)TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  beta_00._M_value._8_8_ = in_stack_fffffffffffffc40;
  beta_00._M_value._0_8_ = in_stack_fffffffffffffc38;
  TPZMatrix<std::complex<double>_>::PrepareZ
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffc20,beta_00,
             in_stack_fffffffffffffc1c);
  this_01 = pTVar4;
  TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  std::complex<double>::complex(local_188,0.0,0.0);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (this_01,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  std::complex<double>::complex(local_228,0.0,0.0);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(this_01,iVar3,iVar2,in_stack_fffffffffffffc38);
  if ((int)(in_RDI->fPivot).super_TPZVec<int>.fNElements < 1) {
    ComputeV1(in_XMM2_Qa,x_00,in_RSI);
    ComputeV2(in_stack_000009f0,in_stack_000009e8,in_stack_000009e0);
  }
  else {
    this_00 = (TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
               *)(long)((int)(in_RDI->fPivot).super_TPZVec<int>.fNElements + 2);
    std::allocator<std::thread>::allocator((allocator<std::thread> *)0x1f86687);
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffbf0,
               (size_type)in_stack_fffffffffffffbe8,(allocator_type *)in_stack_fffffffffffffbe0);
    std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1f866ad);
    TPZDohrPrecondThreadV1Data<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
    TPZDohrPrecondThreadV1Data
              (&local_260,
               (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *)
               in_RDI,in_RSI,(TPZFMatrix<std::complex<double>_> *)(local_188 + 1));
    local_270 = &local_260;
    std::thread::
    thread<void*(&)(void*),TPZDohrPrecondThreadV1Data<std::complex<double>,TPZDohrSubstruct<std::complex<double>>>*,void>
              ((thread *)in_stack_fffffffffffffc10,
               (_func_void_ptr_void_ptr *)in_stack_fffffffffffffc08,
               (TPZDohrPrecondThreadV1Data<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
                **)in_stack_fffffffffffffc00);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xfffffffffffffdc0,0);
    in_stack_fffffffffffffc20 =
         (TPZDohrAssembleList<std::complex<double>_> *)&stack0xfffffffffffffd98;
    std::thread::operator=((thread *)in_stack_fffffffffffffbd0,(thread *)in_stack_fffffffffffffbc8);
    std::thread::~thread((thread *)0x1f86732);
    pvVar5 = operator_new(0xe0);
    local_281 = 1;
    sVar6 = std::__cxx11::
            list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
            ::size((list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
                    *)in_stack_fffffffffffffbd0);
    in_stack_fffffffffffffc1c = (int)sVar6;
    TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)in_stack_fffffffffffffbd0,
               (TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)in_stack_fffffffffffffbc8)
    ;
    TPZDohrAssembleList<std::complex<double>_>::TPZDohrAssembleList
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c,in_stack_fffffffffffffc10,
               (TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)in_stack_fffffffffffffc08)
    ;
    local_281 = 0;
    TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_> *)
               in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)in_stack_fffffffffffffbd0)
    ;
    TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
    TPZDohrPrecondV2SubDataList
              ((TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
                *)in_stack_fffffffffffffbf0,
               (TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_> *)
               in_stack_fffffffffffffbe8);
    std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>::
    _List_const_iterator(local_2d8);
    local_2dc = 0;
    local_2e8 = (_List_node_base *)
                std::__cxx11::
                list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
                ::begin(in_stack_fffffffffffffbc8);
    local_2d8[0]._M_node = local_2e8;
    while( true ) {
      local_2f0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
           ::end(in_stack_fffffffffffffbc8);
      bVar1 = std::operator!=(local_2d8,&local_2f0);
      if (!bVar1) break;
      in_stack_fffffffffffffc10 = (TPZFMatrix<std::complex<double>_> *)operator_new(0x90);
      TPZFMatrix<std::complex<double>_>::TPZFMatrix(in_stack_fffffffffffffc00);
      in_stack_fffffffffffffc08 =
           TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_>::operator->
                     ((TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)
                      &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
      TPZDohrAssembly<std::complex<double>_>::Extract
                ((TPZDohrAssembly<std::complex<double>_> *)in_stack_fffffffffffffc10,
                 (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                 (TPZFMatrix<std::complex<double>_> *)
                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      in_stack_fffffffffffffbfc = local_2dc;
      in_stack_fffffffffffffc00 =
           (TPZFMatrix<std::complex<double>_> *)
           std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>::
           operator*((_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>
                      *)in_stack_fffffffffffffbd0);
      TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::TPZAutoPointer
                ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)in_stack_fffffffffffffbf0,
                 (TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbe8);
      TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
      TPZDohrPrecondV2SubData
                (this_00,(int)((ulong)pvVar5 >> 0x20),
                 (TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_> *)
                 in_stack_fffffffffffffc20,
                 (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer
                ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)in_stack_fffffffffffffbd0);
      TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
      AddItem((TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
               *)in_stack_fffffffffffffbf0,
              (TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
               *)in_stack_fffffffffffffbe8);
      TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
      ~TPZDohrPrecondV2SubData
                ((TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
                  *)in_stack_fffffffffffffbd0);
      std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>::
      operator++(local_2d8,0);
      local_2dc = local_2dc + 1;
    }
    for (local_324 = 0; local_324 < (int)(in_RDI->fPivot).super_TPZVec<int>.fNElements;
        local_324 = local_324 + 1) {
      std::thread::
      thread<void*(&)(void*),TPZDohrPrecondV2SubDataList<std::complex<double>,TPZDohrSubstruct<std::complex<double>>>*,void>
                ((thread *)in_stack_fffffffffffffc10,
                 (_func_void_ptr_void_ptr *)in_stack_fffffffffffffc08,
                 (TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
                  **)in_stack_fffffffffffffc00);
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xfffffffffffffdc0,
                 (long)(local_324 + 2));
      std::thread::operator=
                ((thread *)in_stack_fffffffffffffbd0,(thread *)in_stack_fffffffffffffbc8);
      std::thread::~thread((thread *)0x1f86b2a);
    }
    in_stack_fffffffffffffbf0 =
         TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_>::operator->(&local_278);
    std::thread::thread<void*(&)(void*),TPZDohrAssembleList<std::complex<double>>*,void>
              ((thread *)in_stack_fffffffffffffc10,
               (_func_void_ptr_void_ptr *)in_stack_fffffffffffffc08,
               (TPZDohrAssembleList<std::complex<double>_> **)in_stack_fffffffffffffc00);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xfffffffffffffdc0,1);
    std::thread::operator=((thread *)in_stack_fffffffffffffbd0,(thread *)in_stack_fffffffffffffbc8);
    std::thread::~thread((thread *)0x1f86bae);
    for (local_324 = 0; local_324 < (int)(in_RDI->fPivot).super_TPZVec<int>.fNElements + 2;
        local_324 = local_324 + 1) {
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xfffffffffffffdc0,
                 (long)local_324);
      std::thread::join();
    }
    TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
    ~TPZDohrPrecondV2SubDataList(in_stack_fffffffffffffbd0);
    TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_> *)
               in_stack_fffffffffffffbd0);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffbe0);
  }
  TPZFMatrix<std::complex<double>_>::operator+=
            ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffc20,
             (TPZMatrix<std::complex<double>_> *)
             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  iVar2 = iVar3;
  for (local_358 = 0; local_358 < iVar3; local_358 = local_358 + 1) {
    for (local_d0 = 0; local_d0 < (long)pTVar4; local_d0 = local_d0 + 1) {
      in_stack_fffffffffffffbe0 =
           (TPZSimpleTimer *)
           TPZFMatrix<std::complex<double>_>::operator()
                     ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbf0,iVar2,
                      (int64_t)in_stack_fffffffffffffbe0);
      in_stack_fffffffffffffbd8 =
           TPZFMatrix<std::complex<double>_>::operator()
                     ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbf0,iVar2,
                      (int64_t)in_stack_fffffffffffffbe0);
      std::complex<double>::operator+=
                ((complex<double> *)in_stack_fffffffffffffbd0,
                 (complex<double> *)in_stack_fffffffffffffbc8);
    }
  }
  TPZSimpleTimer::ReturnTimeDouble(in_stack_fffffffffffffbe0);
  TPZStack<double,_10>::Push
            ((TPZStack<double,_10> *)in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1f86d9f);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1f86dac);
  TPZSimpleTimer::~TPZSimpleTimer(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
    
#ifdef USING_TBB
	MultAddTBB(x, y, z, alpha, beta, opt);
	return;
#endif
    
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		this->Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	TPZSimpleTimer precondi; // init of timer
	int64_t rows = this->Rows();
	int64_t cols = this->Cols();
	int64_t c;
	this->PrepareZ(y,z,beta,opt);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		x.Print("x entry vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
	TPZFMatrix<TVar> v1(rows,x.Cols(),0.);
	TPZFMatrix<TVar> v2(cols,x.Cols(),0.);
	if(fNumThreads <= 0)
	{
		ComputeV1(x,v1);
		ComputeV2(x,v2);
	}
	else
	{
        std::vector<std::thread> AllThreads(fNumThreads+2);
		TPZDohrPrecondThreadV1Data<TVar,TSubStruct> v1threaddata(this,x,v1);
		
        AllThreads[0] = thread((TPZDohrPrecondThreadV1Data<TVar,TSubStruct>::ComputeV1), &v1threaddata);
		
		TPZAutoPointer<TPZDohrAssembleList<TVar> > assemblelist = new TPZDohrAssembleList<TVar>(fGlobal.size(),v2,this->fAssemble);
		
		TPZDohrPrecondV2SubDataList<TVar,TSubStruct> v2work(assemblelist);
		typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
		
		int isub=0;
		//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
		for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
		{
			TPZFMatrix<TVar> *Residual_local = new TPZFMatrix<TVar>;
			fAssemble->Extract(isub,x,*Residual_local);
			TPZDohrPrecondV2SubData<TVar,TSubStruct> data(isub,*it,Residual_local);
			v2work.AddItem(data);
		}
		
		int i;
		for (i=0; i<fNumThreads; i++) {
            AllThreads[i+2] = std::thread(TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork, &v2work);
		}
		//		v2work.ThreadWork(&v2work);
		AllThreads[1] = thread(TPZDohrAssembleList<TVar>::Assemble,
                               assemblelist.operator->());
		
		for (i=0; i<fNumThreads+2; i++) {
            AllThreads[i].join();
		}
		//		ComputeV2(x,v2);
	}
	v2 += v1;
	
#ifndef MAKEINTERNAL
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		TPZFNMatrix<100> v2Expand((*it)->fNEquations,1,0.), v3Expand((*it)->fNEquations,1,0.);
		int64_t neqs = (*it)->fGlobalEqs.NElements();
		TPZFMatrix<TVar> v3_local(neqs,1,0.), v2_local(neqs,1,0.);
		fAssemble->Extract(isub,v2,v2_local);
		int64_t i;
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v2Expand(ind.first,0) += v2_local(i,0);
		}
		
		(*it)->Contribute_v3_local(v2Expand,v3Expand);
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v3_local(i,0) += v3Expand(ind.first,0);
		}
#ifdef PZ_LOG
		{
			std::stringstream sout;
			v2Expand.Print("v1+v2 Expand",sout);
			v3Expand.Print("v3 Expand", sout);
			v2_local.Print("v1+v2 local",sout);
			v3_local.Print("v3 local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		fAssemble->Assemble(isub,v3_local,v2);
	}
#endif
	// wait task para finalizacao da chamada
	// esperar a versao correta do v1
	/* Sum v1+v2+v3 with z */
    int64_t xcols = x.Cols();
    for (int64_t ic=0; ic<xcols; ic++)
    {
        for (c=0; c<rows; c++) {
            z(c,ic) += v2(c,ic);
        }
    }
	tempo.fPreCond.Push(precondi.ReturnTimeDouble()); // end of timer
}